

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O2

GCPtr<symbols::Object> __thiscall
evaluator::Evaluator::evalBlockStatement(Evaluator *this,BlockStmt *block,Env *env)

{
  pointer ppSVar1;
  bool bVar2;
  int iVar3;
  Env *this_00;
  pointer ppSVar4;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  this_00 = NewEnvironment(env);
  bVar2 = symbols::Env::is_recurseLimitExceeded(this_00);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"RecursionLimitExceeded: ",&local_61);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"recursion depth exceeded limit",&local_62);
    newError(this,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    ppSVar1 = (block->Stmts).super__Vector_base<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppSVar4 = (block->Stmts).super__Vector_base<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppSVar4 != ppSVar1;
        ppSVar4 = ppSVar4 + 1) {
      Eval(this,&(*ppSVar4)->super_Node,this_00);
      if ((*(undefined8 **)this != (undefined8 *)0x0) &&
         (iVar3 = (**(code **)**(undefined8 **)this)(), iVar3 - 3U < 2)) {
        return (GCPtr<symbols::Object>)(Object *)this;
      }
      GCPtr<symbols::Object>::~GCPtr((GCPtr<symbols::Object> *)this);
    }
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,&NATIVE_NULL);
  }
  return (GCPtr<symbols::Object>)(Object *)this;
}

Assistant:

GCPtr<Object> Evaluator::evalBlockStatement(BlockStmt* block, Env* env){
    auto scope = NewEnvironment(env);
    if(scope->is_recurseLimitExceeded())
        return newError("RecursionLimitExceeded: ", "recursion depth exceeded limit");

    for(auto stmt : block->Stmts){
        GCPtr<Object> result = Eval(stmt, scope);
        if(result != nullptr){
            auto type = result->type();
            if(type == Types::RETURNTYPE || type == Types::ERRORTYPE){
                return result;
            }
        }
    }
    return NATIVE_NULL;
}